

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::retain(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  UBool UVar1;
  int local_38;
  int local_34;
  UChar32 b;
  UChar32 a;
  int32_t k;
  int32_t j;
  int32_t i;
  UErrorCode status;
  int8_t polarity_local;
  UChar32 *pUStack_18;
  int32_t otherLen_local;
  UChar32 *other_local;
  UnicodeSet *this_local;
  
  i._3_1_ = polarity;
  status = otherLen;
  pUStack_18 = other;
  other_local = (UChar32 *)this;
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    j = 0;
    ensureBufferCapacity(this,this->len + status,&j);
    UVar1 = ::U_FAILURE(j);
    if (UVar1 == '\0') {
      b = 0;
      local_34 = *this->list;
      local_38 = *pUStack_18;
      a = 1;
      k = 1;
      do {
        switch(i._3_1_) {
        case 0:
          if (local_34 < local_38) {
            local_34 = this->list[k];
            i._3_1_ = i._3_1_ ^ 1;
            k = k + 1;
          }
          else {
            if (local_38 < local_34) {
              local_38 = pUStack_18[a];
              i._3_1_ = i._3_1_ ^ 2;
            }
            else {
              if (local_34 == 0x110000) goto LAB_003cbcdd;
              this->buffer[b] = local_34;
              local_34 = this->list[k];
              local_38 = pUStack_18[a];
              i._3_1_ = i._3_1_ ^ 3;
              b = b + 1;
              k = k + 1;
            }
            a = a + 1;
          }
          break;
        case 1:
          if (local_34 < local_38) {
            local_34 = this->list[k];
            i._3_1_ = i._3_1_ ^ 1;
            k = k + 1;
          }
          else {
            if (local_38 < local_34) {
              this->buffer[b] = local_38;
              local_38 = pUStack_18[a];
              i._3_1_ = i._3_1_ ^ 2;
              b = b + 1;
            }
            else {
              if (local_34 == 0x110000) goto LAB_003cbcdd;
              local_34 = this->list[k];
              local_38 = pUStack_18[a];
              i._3_1_ = i._3_1_ ^ 3;
              k = k + 1;
            }
            a = a + 1;
          }
          break;
        case 2:
          if (local_38 < local_34) {
            local_38 = pUStack_18[a];
            i._3_1_ = i._3_1_ ^ 2;
            a = a + 1;
          }
          else {
            if (local_34 < local_38) {
              this->buffer[b] = local_34;
              local_34 = this->list[k];
              i._3_1_ = i._3_1_ ^ 1;
              b = b + 1;
            }
            else {
              if (local_34 == 0x110000) goto LAB_003cbcdd;
              local_34 = this->list[k];
              local_38 = pUStack_18[a];
              i._3_1_ = i._3_1_ ^ 3;
              a = a + 1;
            }
            k = k + 1;
          }
          break;
        case 3:
          if (local_34 < local_38) {
            this->buffer[b] = local_34;
            local_34 = this->list[k];
            i._3_1_ = i._3_1_ ^ 1;
            k = k + 1;
          }
          else {
            if (local_38 < local_34) {
              this->buffer[b] = local_38;
              local_38 = pUStack_18[a];
              i._3_1_ = i._3_1_ ^ 2;
            }
            else {
              if (local_34 == 0x110000) {
LAB_003cbcdd:
                this->buffer[b] = 0x110000;
                this->len = b + 1;
                swapBuffers(this);
                releasePattern(this);
                return;
              }
              this->buffer[b] = local_34;
              local_34 = this->list[k];
              local_38 = pUStack_18[a];
              i._3_1_ = i._3_1_ ^ 3;
              k = k + 1;
            }
            a = a + 1;
          }
          b = b + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void UnicodeSet::retain(const UChar32* other, int32_t otherLen, int8_t polarity) {
    if (isFrozen() || isBogus()) {
        return;
    }
    UErrorCode status = U_ZERO_ERROR;
    ensureBufferCapacity(len + otherLen, status);
    if (U_FAILURE(status)) {
        return;
    }

    int32_t i = 0, j = 0, k = 0;
    UChar32 a = list[i++];
    UChar32 b = other[j++];
    // change from xor is that we have to check overlapping pairs
    // polarity bit 1 means a is second, bit 2 means b is.
    for (;;) {
        switch (polarity) {
          case 0: // both first; drop the smaller
            if (a < b) { // drop a
                a = list[i++];
                polarity ^= 1;
            } else if (b < a) { // drop b
                b = other[j++];
                polarity ^= 2;
            } else { // a == b, take one, drop other
                if (a == UNICODESET_HIGH) goto loop_end;
                buffer[k++] = a;
                a = list[i++];
                polarity ^= 1;
                b = other[j++];
                polarity ^= 2;
            }
            break;
          case 3: // both second; take lower if unequal
            if (a < b) { // take a
                buffer[k++] = a;
                a = list[i++];
                polarity ^= 1;
            } else if (b < a) { // take b
                buffer[k++] = b;
                b = other[j++];
                polarity ^= 2;
            } else { // a == b, take one, drop other
                if (a == UNICODESET_HIGH) goto loop_end;
                buffer[k++] = a;
                a = list[i++];
                polarity ^= 1;
                b = other[j++];
                polarity ^= 2;
            }
            break;
          case 1: // a second, b first;
            if (a < b) { // NO OVERLAP, drop a
                a = list[i++];
                polarity ^= 1;
            } else if (b < a) { // OVERLAP, take b
                buffer[k++] = b;
                b = other[j++];
                polarity ^= 2;
            } else { // a == b, drop both!
                if (a == UNICODESET_HIGH) goto loop_end;
                a = list[i++];
                polarity ^= 1;
                b = other[j++];
                polarity ^= 2;
            }
            break;
          case 2: // a first, b second; if a < b, overlap
            if (b < a) { // no overlap, drop b
                b = other[j++];
                polarity ^= 2;
            } else  if (a < b) { // OVERLAP, take a
                buffer[k++] = a;
                a = list[i++];
                polarity ^= 1;
            } else { // a == b, drop both!
                if (a == UNICODESET_HIGH) goto loop_end;
                a = list[i++];
                polarity ^= 1;
                b = other[j++];
                polarity ^= 2;
            }
            break;
        }
    }
 loop_end:
    buffer[k++] = UNICODESET_HIGH;    // terminate
    len = k;
    swapBuffers();
    releasePattern();
}